

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void goodform::json::write_string(string *input,ostream *output)

{
  byte bVar1;
  undefined8 in_RAX;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(output,"\"",1);
  if (input->_M_string_length != 0) {
    uVar4 = 0;
    do {
      bVar1 = (input->_M_dataplus)._M_p[uVar4];
      if (bVar1 < 0x22) {
        switch(bVar1) {
        case 8:
          lVar2 = 2;
          pcVar3 = "\\b";
          break;
        case 9:
          lVar2 = 2;
          pcVar3 = "\\t";
          break;
        case 10:
          lVar2 = 2;
          pcVar3 = "\\n";
          break;
        default:
switchD_001300c2_caseD_b:
          uStack_38 = CONCAT17(bVar1,(undefined7)uStack_38);
          lVar2 = 1;
          pcVar3 = (char *)((long)&uStack_38 + 7);
          break;
        case 0xc:
          lVar2 = 2;
          pcVar3 = "\\f";
          break;
        case 0xd:
          lVar2 = 2;
          pcVar3 = "\\r";
        }
      }
      else if (bVar1 == 0x22) {
        lVar2 = 2;
        pcVar3 = "\\\"";
      }
      else if (bVar1 == 0x2f) {
        lVar2 = 2;
        pcVar3 = "\\/";
      }
      else {
        if (bVar1 != 0x5c) goto switchD_001300c2_caseD_b;
        lVar2 = 2;
        pcVar3 = "\\\\";
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar3,lVar2);
      uVar4 = uVar4 + 1;
    } while (uVar4 < input->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"\"",1);
  return;
}

Assistant:

void json::write_string(const std::string& input, std::ostream& output)
  {
    output << "\"";
    for (unsigned long i = 0; i < input.length(); ++i)
    {
      char c = input[i];
      if (c == '\\')
        output << "\\\\";
      else if (c == '/')
        output << "\\/";
      else if (c == '"')
        output << "\\\"";
      else if (c == '\b')
        output << "\\b";
      else if (c == '\f')
        output << "\\f";
      else if (c == '\n')
        output << "\\n";
      else if (c == '\r')
        output << "\\r";
      else if (c == '\t')
        output << "\\t";
      else
        output << c;
    }
    output << "\"";
  }